

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

uint8_t __thiscall wabt::DataSegment::GetFlags(DataSegment *this,Module *module)

{
  Index IVar1;
  byte local_19;
  Index memory_index;
  uint8_t flags;
  Module *module_local;
  DataSegment *this_local;
  
  local_19 = this->kind == Passive;
  IVar1 = Module::GetMemoryIndex(module,&this->memory_var);
  if (IVar1 != 0) {
    local_19 = local_19 | 2;
  }
  return local_19;
}

Assistant:

uint8_t DataSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  if (kind == SegmentKind::Passive) {
    flags |= SegPassive;
  }

  Index memory_index = module->GetMemoryIndex(memory_var);
  if (memory_index != 0) {
    flags |= SegExplicitIndex;
  }

  return flags;
}